

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

json_t * json_array_deep_copy(json_t *array,hashtable_t *parents)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  json_t *pjVar4;
  size_t local_50;
  size_t loop_key_len;
  char loop_key [19];
  size_t i;
  json_t *result;
  hashtable_t *parents_local;
  json_t *array_local;
  
  iVar2 = jsonp_loop_check(parents,array,(char *)&loop_key_len,0x13,&local_50);
  if (iVar2 == 0) {
    i = (size_t)json_array();
    if ((json_t *)i != (json_t *)0x0) {
      for (stack0xffffffffffffffd0 = 0; uVar1 = stack0xffffffffffffffd0,
          sVar3 = json_array_size(array), uVar1 < sVar3;
          register0x00000000 = stack0xffffffffffffffd0 + 1) {
        pjVar4 = json_array_get(array,stack0xffffffffffffffd0);
        pjVar4 = do_deep_copy(pjVar4,parents);
        iVar2 = json_array_append_new((json_t *)i,pjVar4);
        if (iVar2 != 0) {
          json_decref((json_t *)i);
          i = 0;
          break;
        }
      }
    }
    hashtable_del(parents,(char *)&loop_key_len,local_50);
    array_local = (json_t *)i;
  }
  else {
    array_local = (json_t *)0x0;
  }
  return array_local;
}

Assistant:

static json_t *json_array_deep_copy(const json_t *array, hashtable_t *parents) {
    json_t *result;
    size_t i;
    char loop_key[LOOP_KEY_LEN];
    size_t loop_key_len;

    if (jsonp_loop_check(parents, array, loop_key, sizeof(loop_key), &loop_key_len))
        return NULL;

    result = json_array();
    if (!result)
        goto out;

    for (i = 0; i < json_array_size(array); i++) {
        if (json_array_append_new(result,
                                  do_deep_copy(json_array_get(array, i), parents))) {
            json_decref(result);
            result = NULL;
            break;
        }
    }

    out:
    hashtable_del(parents, loop_key, loop_key_len);

    return result;
}